

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O1

int __thiscall CmdOpts::find(CmdOpts *this,char letter)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Option *pOVar4;
  
  uVar1 = this->_numOpts;
  if ((int)uVar1 < 1) {
    return 0;
  }
  pOVar4 = this->_opts;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (pOVar4->letter == letter) break;
    uVar2 = uVar2 + 1;
    pOVar4 = pOVar4 + 1;
    uVar3 = (ulong)uVar1;
  } while (uVar1 != uVar2);
  return (int)uVar3;
}

Assistant:

int
CmdOpts::find(char letter)
{
    int optIdx;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
        if (_opts[optIdx].letter == letter)
            break;

    return optIdx;
}